

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

int32_t __thiscall
icu_63::DayPeriodRules::getStartHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  uint uVar1;
  int32_t i;
  long lVar2;
  uint uVar3;
  
  if (U_ZERO_ERROR < *errorCode) {
    return -1;
  }
  if (dayPeriod != DAYPERIOD_MIDNIGHT) {
    if (dayPeriod == DAYPERIOD_NOON) {
      return 0xc;
    }
    if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
      uVar1 = 0x16;
      while( true ) {
        uVar3 = uVar1;
        if (uVar3 == 0) break;
        uVar1 = uVar3 - 1;
        if (this->fDayPeriodForHour[uVar3] != dayPeriod) {
          return uVar3 + 1;
        }
      }
    }
    else {
      for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 1) {
        if (this->fDayPeriodForHour[lVar2] == dayPeriod) {
          return (int32_t)lVar2;
        }
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  return 0;
}

Assistant:

int32_t DayPeriodRules::getStartHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. Start hour is later than end hour.
        for (int32_t i = 22; i >= 1; --i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                return (i + 1);
            }
        }
    } else {
        for (int32_t i = 0; i <= 23; ++i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return i;
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}